

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  Instruction i;
  int local_28;
  int b;
  int c;
  int tostore_local;
  int nelems_local;
  int base_local;
  FuncState *fs_local;
  
  i = (nelems + -1) / 0x32 + 1;
  local_28 = tostore;
  if (tostore == -1) {
    local_28 = 0;
  }
  if ((int)i < 0x200) {
    luaK_codeABC(fs,OP_SETLIST,base,local_28,i);
  }
  else {
    luaK_codeABC(fs,OP_SETLIST,base,local_28,0);
    luaK_code(fs,i,fs->ls->lastline);
  }
  fs->freereg = base + 1;
  return;
}

Assistant:

static void luaK_setlist(FuncState*fs,int base,int nelems,int tostore){
int c=(nelems-1)/50+1;
int b=(tostore==(-1))?0:tostore;
if(c<=((1<<9)-1))
luaK_codeABC(fs,OP_SETLIST,base,b,c);
else{
luaK_codeABC(fs,OP_SETLIST,base,b,0);
luaK_code(fs,cast(Instruction,c),fs->ls->lastline);
}
fs->freereg=base+1;
}